

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbMallocRaw(sqlite3 *db,int n)

{
  LookasideSlot *pLVar1;
  void *pvVar2;
  LookasideSlot *pBuf;
  void *p;
  int n_local;
  sqlite3 *db_local;
  
  if (db != (sqlite3 *)0x0) {
    if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    if ((db->lookaside).bEnabled != '\0') {
      if ((int)(uint)(db->lookaside).sz < n) {
        (db->lookaside).anStat[1] = (db->lookaside).anStat[1] + 1;
      }
      else {
        pLVar1 = (db->lookaside).pFree;
        if (pLVar1 != (LookasideSlot *)0x0) {
          (db->lookaside).pFree = pLVar1->pNext;
          (db->lookaside).nOut = (db->lookaside).nOut + 1;
          (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
          if ((db->lookaside).nOut <= (db->lookaside).mxOut) {
            return pLVar1;
          }
          (db->lookaside).mxOut = (db->lookaside).nOut;
          return pLVar1;
        }
        (db->lookaside).anStat[2] = (db->lookaside).anStat[2] + 1;
      }
    }
  }
  pvVar2 = sqlite3Malloc(n);
  if ((pvVar2 == (void *)0x0) && (db != (sqlite3 *)0x0)) {
    db->mallocFailed = '\x01';
  }
  return pvVar2;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRaw(sqlite3 *db, int n){
  void *p;
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( db==0 || db->pnBytesFreed==0 );
#ifndef SQLITE_OMIT_LOOKASIDE
  if( db ){
    LookasideSlot *pBuf;
    if( db->mallocFailed ){
      return 0;
    }
    if( db->lookaside.bEnabled ){
      if( n>db->lookaside.sz ){
        db->lookaside.anStat[1]++;
      }else if( (pBuf = db->lookaside.pFree)==0 ){
        db->lookaside.anStat[2]++;
      }else{
        db->lookaside.pFree = pBuf->pNext;
        db->lookaside.nOut++;
        db->lookaside.anStat[0]++;
        if( db->lookaside.nOut>db->lookaside.mxOut ){
          db->lookaside.mxOut = db->lookaside.nOut;
        }
        return (void*)pBuf;
      }
    }
  }
#else
  if( db && db->mallocFailed ){
    return 0;
  }
#endif
  p = sqlite3Malloc(n);
  if( !p && db ){
    db->mallocFailed = 1;
  }
  sqlite3MemdebugSetType(p, MEMTYPE_DB |
         ((db && db->lookaside.bEnabled) ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
  return p;
}